

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Lib::Array<bool>::expandToFit(Array<bool> *this,size_t n)

{
  bool *__ptr;
  void *placement;
  bool *pbVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  size_t size;
  
  uVar4 = this->_capacity * 2;
  size = n + 1;
  if (n < uVar4) {
    size = uVar4;
  }
  placement = Lib::alloc(size);
  pbVar1 = array_new<bool>(placement,size);
  uVar4 = this->_capacity;
  __ptr = this->_array;
  if (uVar4 != 0) {
    uVar2 = uVar4 & 0xffffffff;
    while( true ) {
      uVar2 = uVar2 - 1;
      if ((int)(uint)uVar2 < 0) break;
      uVar3 = (uint)uVar2 & 0x7fffffff;
      pbVar1[uVar3] = __ptr[uVar3];
    }
  }
  if (__ptr != (bool *)0x0) {
    Lib::free(__ptr);
    uVar4 = this->_capacity;
  }
  this->_array = pbVar1;
  (**this->_vptr_Array)(this,uVar4,size);
  this->_capacity = size;
  return;
}

Assistant:

void expandToFit (size_t n)
  {
    ASS(n >= _capacity);

    // determine new capacity (at least double the old one)
    size_t newCapacity = 2 * _capacity;
    if (newCapacity <= n) {
      newCapacity = n+1;
    }

    // allocate new array and copy old array's content to the new place
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"Array<>");
    C* newArray = array_new<C>(mem, newCapacity);
    if(_capacity) {
      for (int i = _capacity-1;i >= 0;i--) {
	newArray[i] = _array[i];
      }
    }

    if(_array) {
      // deallocate the old array
      array_delete(_array,_capacity);
      DEALLOC_KNOWN(_array,_capacity*sizeof(C),"Array<>");
    }

    _array = newArray;
    fillInterval(_capacity,newCapacity);
    _capacity = newCapacity;
  }